

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

int SUNMatZero_Dense(SUNMatrix A)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *(long *)((long)A->content + 0x10);
  lVar2 = *(long *)((long)A->content + 0x18);
  for (lVar3 = 0; lVar3 < lVar2; lVar3 = lVar3 + 1) {
    *(undefined8 *)(lVar1 + lVar3 * 8) = 0;
  }
  return 0;
}

Assistant:

int SUNMatZero_Dense(SUNMatrix A)
{
  sunindextype i;
  realtype *Adata;

  /* Perform operation */
  Adata = SM_DATA_D(A);
  for (i=0; i<SM_LDATA_D(A); i++)
    Adata[i] = ZERO;
  return 0;
}